

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirstWorkingReporter.cpp
# Opt level: O2

void __thiscall
ApprovalTests::FirstWorkingReporter::FirstWorkingReporter
          (FirstWorkingReporter *this,
          vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>
          *theReporters)

{
  pointer ppRVar1;
  pointer ppRVar2;
  shared_ptr<ApprovalTests::Reporter> sStack_38;
  
  (this->super_Reporter)._vptr_Reporter = (_func_int **)&PTR__FirstWorkingReporter_001557f8;
  (this->reporters).
  super__Vector_base<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->reporters).
  super__Vector_base<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->reporters).
  super__Vector_base<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppRVar1 = (theReporters->
            super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppRVar2 = (theReporters->
                 super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppRVar2 != ppRVar1;
      ppRVar2 = ppRVar2 + 1) {
    ::std::__shared_ptr<ApprovalTests::Reporter,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<ApprovalTests::Reporter,void>
              ((__shared_ptr<ApprovalTests::Reporter,(__gnu_cxx::_Lock_policy)2> *)&sStack_38,
               *ppRVar2);
    ::std::
    vector<std::shared_ptr<ApprovalTests::Reporter>,std::allocator<std::shared_ptr<ApprovalTests::Reporter>>>
    ::emplace_back<std::shared_ptr<ApprovalTests::Reporter>>
              ((vector<std::shared_ptr<ApprovalTests::Reporter>,std::allocator<std::shared_ptr<ApprovalTests::Reporter>>>
                *)&this->reporters,&sStack_38);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sStack_38.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

FirstWorkingReporter::FirstWorkingReporter(const std::vector<Reporter*>& theReporters)
    {
        for (auto r : theReporters)
        {
            reporters.push_back(std::shared_ptr<Reporter>(r));
        }
    }